

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::reset(CompilerGLSL *this)

{
  ParsedIR *this_00;
  uint uVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  SPIRFunction *pSVar4;
  SPIRVariable *pSVar5;
  long lVar6;
  LoopLock loop_lock;
  LoopLock local_30;
  
  Compiler::clear_force_recompile(&this->super_Compiler);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).invalid_expressions._M_h);
  (this->super_Compiler).current_function = (SPIRFunction *)0x0;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->expression_usage_counts)._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).forwarded_temporaries._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).suppressed_usage_tracking._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->flushed_phi_variables)._M_h);
  reset_name_caches(this);
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar2 = (this->super_Compiler).ir.ids_for_type[4].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_Compiler).ir.ids_for_type[4].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar6 = 0; sVar3 << 2 != lVar6; lVar6 = lVar6 + 4) {
    uVar1 = *(uint *)((long)&pTVar2->id + lVar6);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar1].type ==
        TypeFunction) {
      pSVar4 = ParsedIR::get<spirv_cross::SPIRFunction>(this_00,uVar1);
      pSVar4->active = false;
      pSVar4->flush_undeclared = true;
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_30);
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar2 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar6 = 0; sVar3 << 2 != lVar6; lVar6 = lVar6 + 4) {
    uVar1 = *(uint *)((long)&pTVar2->id + lVar6);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar1].type ==
        TypeVariable) {
      pSVar5 = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar1);
      (pSVar5->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size
           = 0;
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_30);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRExpression>(this_00);
  ParsedIR::reset_all_of_type<spirv_cross::SPIRAccessChain>(this_00);
  this->statement_count = 0;
  this->indent = 0;
  (this->super_Compiler).current_loop_level = 0;
  return;
}

Assistant:

void CompilerGLSL::reset()
{
	// We do some speculative optimizations which should pretty much always work out,
	// but just in case the SPIR-V is rather weird, recompile until it's happy.
	// This typically only means one extra pass.
	clear_force_recompile();

	// Clear invalid expression tracking.
	invalid_expressions.clear();
	current_function = nullptr;

	// Clear temporary usage tracking.
	expression_usage_counts.clear();
	forwarded_temporaries.clear();
	suppressed_usage_tracking.clear();

	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	flushed_phi_variables.clear();

	reset_name_caches();

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.active = false;
		func.flush_undeclared = true;
	});

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) { var.dependees.clear(); });

	ir.reset_all_of_type<SPIRExpression>();
	ir.reset_all_of_type<SPIRAccessChain>();

	statement_count = 0;
	indent = 0;
	current_loop_level = 0;
}